

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_151d8d0::GetSseSum16x16DualTest_RefMseSum_Test::TestBody
          (GetSseSum16x16DualTest_RefMseSum_Test *this)

{
  MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>
  *in_stack_00000570;
  
  MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>
  ::RefTestSseSumDual(in_stack_00000570);
  return;
}

Assistant:

TEST_P(GetSseSum16x16DualTest, RefMseSum) { RefTestSseSumDual(); }